

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getCenterOfMassPosition
          (KinDynComputations *this,Span<double,__1L> pos)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  pointer __dest;
  Index size;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  KinDynComputations KStack_48;
  
  __dest = pos.storage_.data_;
  if (pos.storage_.super_extent_type<_1L>.size_.size_ != 3) {
    iDynTree::reportError("KinDynComputations","getCenterOfMassPosition","Wrong size in input pos");
    goto LAB_00110358;
  }
  getCenterOfMassPosition(&KStack_48);
  uVar5 = 3;
  if (((undefined1  [16])pos.storage_ & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    uVar5 = (ulong)((uint)((ulong)__dest >> 3) & 1);
  }
  uVar6 = uVar5 ^ 3;
  uVar1 = (uint)(1 < uVar6) * 2;
  iVar2 = (int)uVar5;
  uVar4 = uVar1 + iVar2;
  if (uVar5 == 0) {
LAB_0011030d:
    uVar5 = (ulong)(uint)(iVar2 << 3);
    uVar3 = *(undefined8 *)((long)&KStack_48.pimpl + uVar5);
    *(undefined8 *)((long)__dest + uVar5) =
         *(undefined8 *)((long)&KStack_48._vptr_KinDynComputations + uVar5);
    ((undefined8 *)((long)__dest + uVar5))[1] = uVar3;
  }
  else {
    memcpy(__dest,&KStack_48,(ulong)(uint)(iVar2 * 8));
    if (1 < (uint)uVar6) goto LAB_0011030d;
  }
  if (uVar4 < 3) {
    uVar5 = (ulong)(uVar4 * 8);
    memcpy((void *)((long)__dest + uVar5),
           (void *)((long)&KStack_48._vptr_KinDynComputations + uVar5),(uVar6 - uVar1) * 8);
  }
LAB_00110358:
  return pos.storage_.super_extent_type<_1L>.size_.size_ == 3;
}

Assistant:

bool KinDynComputations::getCenterOfMassPosition(Span<double> pos)
{
    constexpr int expected_position_size = 3;
    bool ok = pos.size() == expected_position_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCenterOfMassPosition","Wrong size in input pos");
        return false;
    }

    toEigen(pos) = toEigen(getCenterOfMassPosition());

    return true;
}